

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::BarDataDrawer::DrawData
          (BarDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  Trafo *pTVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  if (((this->super_DataDrawerBase).mXTrafo == (Trafo *)0x0) ||
     ((this->super_DataDrawerBase).mYTrafo == (Trafo *)0x0)) {
    bVar6 = false;
  }
  else {
    lVar3 = PlotDataBase::GetSize(inXData);
    lVar4 = PlotDataBase::GetSize(inYData);
    bVar6 = false;
    if ((lVar3 <= lVar4) && ((this->super_DataDrawerBase).mPlotCount != 0)) {
      if ((this->super_DataDrawerBase).field_0x24 == '\x01') {
        iVar2 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[4])
                          (this,inXData,inYData,inPlotDataSelection,inXAxisSetup,inRect);
        return SUB41(iVar2,0);
      }
      (*((this->super_DataDrawerBase).mYTrafo)->_vptr_Trafo[2])(0);
      lVar3 = inRect->mW;
      lVar4 = PlotDataBase::GetSize(inXData);
      uVar5 = lVar3 / lVar4;
      lVar3 = PlotDataBase::GetSize(inXData);
      bVar6 = true;
      if (0 < lVar3) {
        lVar3 = 0;
        do {
          pTVar1 = (this->super_DataDrawerBase).mXTrafo;
          PlotDataBase::GetValue(inXData,lVar3);
          (*pTVar1->_vptr_Trafo[2])(pTVar1);
          pTVar1 = (this->super_DataDrawerBase).mYTrafo;
          PlotDataBase::GetValue(inYData,lVar3);
          (*pTVar1->_vptr_Trafo[2])(pTVar1);
          (*inPainter->_vptr_Painter[1])
                    (inPainter,
                     (ulong)(uint)((int)extraout_XMM0_Da_00 -
                                  ((int)(((uint)(uVar5 >> 0x1f) & 1) + (int)uVar5) >> 1)),
                     (ulong)(uint)(int)extraout_XMM0_Da_01,uVar5,
                     (ulong)(uint)((int)extraout_XMM0_Da - (int)extraout_XMM0_Da_01));
          lVar3 = lVar3 + 1;
          lVar4 = PlotDataBase::GetSize(inXData);
        } while (lVar3 < lVar4);
        bVar6 = true;
      }
    }
  }
  return bVar6;
}

Assistant:

bool BarDataDrawer::DrawData (const PlotDataBase &inXData, const PlotDataBase &inYData, const PlotDataSelection &inPlotDataSelection, const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {
      if (!mXTrafo || !mYTrafo) {
        return false;
      }
      if (inXData.GetSize ()>inYData.GetSize ()) {
        return false;
      }
      if (!mPlotCount) {
          return false;
      }
      if (mDrawOnlyLastPoint) {
        return DrawOnlyLastPoint (inXData, inYData, inPlotDataSelection, inXAxisSetup, inRect, inPainter);
      }

      int theTraX, theTraY;
      int theTraY0 = mYTrafo->Transform (0);

      int theLeft, theTop, theWidth, theHeight;

      theWidth = inRect.mW/inXData.GetSize ();
      
      for (long theI=0;theI<inXData.GetSize ();theI++) {
        theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        theTraY = mYTrafo->Transform (inYData.GetValue (theI));

        theLeft = theTraX-theWidth/2;
        theTop = theTraY;
        theHeight = theTraY0-theTop;

        inPainter.FillRect (theLeft, theTop, theWidth, theHeight);
      }
      return true;
    }